

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::BasicAtomicCase3::RunIteration
          (BasicAtomicCase3 *this,uvec3 *param_1,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  long size;
  bool bVar1;
  GLuint GVar2;
  ostream *poVar3;
  bool *compile_error;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  allocator_type local_1d1;
  vector<int,_std::allocator<int>_> idata;
  vector<unsigned_int,_std::allocator<unsigned_int>_> udata;
  
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&udata);
  poVar3 = std::operator<<((ostream *)
                           &udata.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           "\nlayout(local_size_x = ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,", local_size_y = ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,", local_size_z = ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,
                           ") in;\nlayout(std430, binding = 0) buffer Output {\n  uint g_uint_out[")
  ;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"];\n  int g_int_out[");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"];\n};\nshared uint g_shared_uint[");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"];\nshared int g_shared_int[");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,
                  "];\nuniform uint g_uint_value[8] = uint[8](3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u);\nvoid main() {\n  atomicExchange(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[0]);\n  atomicMin(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[1]);\n  atomicMax(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[2]);\n  atomicAnd(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[3]);\n  atomicOr(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[4]);\n  atomicXor(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[5]);\n  atomicCompSwap(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[6], g_uint_value[7]);\n\n  atomicExchange(g_shared_int[gl_LocalInvocationIndex], 3);\n  atomicMin(g_shared_int[gl_LocalInvocationIndex], 1);\n  atomicMax(g_shared_int[gl_LocalInvocationIndex], 2);\n  atomicAnd(g_shared_int[gl_LocalInvocationIndex], 0x1);\n  if (g_uint_value[1] > 0u) {\n    atomicOr(g_shared_int[gl_LocalInvocationIndex], 0x3);\n    atomicXor(g_shared_int[gl_LocalInvocationIndex], 0x1);\n    atomicCompSwap(g_shared_int[gl_LocalInvocationIndex], 0x2, 0x7);\n  }\n\n  g_uint_out[gl_LocalInvocationIndex] = g_shared_uint[gl_LocalInvocationIndex];\n  g_int_out[gl_LocalInvocationIndex] = g_shared_int[gl_LocalInvocationIndex];\n}"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&udata);
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,(string *)&idata);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&idata);
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar1) {
    uVar5 = param_1->m_data[1] * param_1->m_data[0] * param_1->m_data[2];
    GVar2 = this->m_storage_buffer;
    if (GVar2 == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
      GVar2 = this->m_storage_buffer;
    }
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,GVar2);
    uVar6 = (ulong)uVar5;
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,uVar6 * 8,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    if (dispatch_indirect) {
      udata.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&DAT_100000001;
      udata.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 1;
      GVar2 = this->m_dispatch_buffer;
      if (GVar2 == 0) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
        GVar2 = this->m_dispatch_buffer;
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,GVar2);
      glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,&udata,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
    }
    else {
      glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    }
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&udata,uVar6,(allocator_type *)&idata);
    size = uVar6 * 4;
    glu::CallLogWrapper::glGetBufferSubData
              (this_00,0x90d2,0,size,
               udata.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      if (udata.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4] != 7) {
        bVar1 = false;
        anon_unknown_0::Output
                  ("uData at index %d is %d should be %d.\n",uVar4,
                   (ulong)udata.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar4],7);
        goto LAB_009d1f07;
      }
    }
    std::vector<int,_std::allocator<int>_>::vector(&idata,uVar6,&local_1d1);
    glu::CallLogWrapper::glGetBufferSubData
              (this_00,0x90d2,size,size,
               idata.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start);
    uVar4 = 0;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar6 = uVar4;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      if (idata.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar4] != 7) {
        anon_unknown_0::Output
                  ("iData at index %d is %d should be %d.\n",uVar4 & 0xffffffff,
                   (ulong)(uint)idata.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar4],7);
        break;
      }
    }
    bVar1 = (long)(int)uVar5 <= (long)uVar4;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&idata.super__Vector_base<int,_std::allocator<int>_>);
LAB_009d1f07:
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&udata.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool RunIteration(const uvec3& local_size, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		const GLuint kBufferSize = local_size.x() * local_size.y() * local_size.z();

		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * kBufferSize * 2, NULL, GL_DYNAMIC_DRAW);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			const GLuint num_groups[3] = { 1, 1, 1 };
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(1, 1, 1);
		}
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		std::vector<GLuint> udata(kBufferSize);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * kBufferSize, &udata[0]);
		for (GLuint i = 0; i < kBufferSize; ++i)
		{
			if (udata[i] != 7)
			{
				Output("uData at index %d is %d should be %d.\n", i, udata[i], 7);
				return false;
			}
		}

		std::vector<GLint> idata(kBufferSize);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * kBufferSize, sizeof(GLint) * kBufferSize,
						   &idata[0]);
		for (GLint i = 0; i < static_cast<GLint>(kBufferSize); ++i)
		{
			if (idata[i] != 7)
			{
				Output("iData at index %d is %d should be %d.\n", i, idata[i], 7);
				return false;
			}
		}

		return true;
	}